

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O2

Status __thiscall leveldb::ReadFileToString(leveldb *this,Env *env,string *fname,string *data)

{
  void *pvVar1;
  Slice fragment;
  SequentialFile *file;
  char *local_50;
  long local_48;
  long *local_40;
  Status local_38;
  
  data->_M_string_length = 0;
  *(data->_M_dataplus)._M_p = '\0';
  (*env->_vptr_Env[2])();
  if (*(long *)this == 0) {
    pvVar1 = operator_new__(0x2000);
    do {
      local_50 = "";
      local_48 = 0;
      (**(code **)(*local_40 + 0x10))(&local_38,local_40,0x2000,&local_50,pvVar1);
      Status::operator=((Status *)this,&local_38);
      Status::~Status(&local_38);
      if (*(long *)this != 0) break;
      std::__cxx11::string::append((char *)data,(ulong)local_50);
    } while (local_48 != 0);
    operator_delete__(pvVar1);
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status ReadFileToString(Env *env, const std::string &fname, std::string *data) {
        data->clear();
        SequentialFile *file;
        Status s = env->NewSequentialFile(fname, &file);
        if (!s.ok()) {
            return s;
        }
        static const int kBufferSize = 8192;
        char *space = new char[kBufferSize];
        while (true) {
            Slice fragment;
            s = file->Read(kBufferSize, &fragment, space);
            if (!s.ok()) {
                break;
            }
            data->append(fragment.data(), fragment.size());
            if (fragment.empty()) {
                break;
            }
        }
        delete[] space;
        delete file;
        return s;
    }